

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Node * __thiscall rw::ColorQuant::getNode(ColorQuant *this,Node *root,uint32 addr,int32 level)

{
  Node *pNVar1;
  uint uVar2;
  
  while (level != 0) {
    uVar2 = addr & 0xf;
    if (root->children[uVar2] == (Node *)0x0) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 1117"
      ;
      pNVar1 = (Node *)(*DAT_00149de8)(0xb0);
      pNVar1->r = 0;
      pNVar1->g = 0;
      pNVar1->b = 0;
      pNVar1->a = 0;
      pNVar1->numPixels = 0;
      memset(&pNVar1->parent,0,0x98);
      if (level == 1) {
        (pNVar1->link).next = &(this->leaves).link;
        (pNVar1->link).prev = (this->leaves).link.prev;
        ((this->leaves).link.prev)->next = &pNVar1->link;
        (this->leaves).link.prev = &pNVar1->link;
      }
      root->children[uVar2] = pNVar1;
      pNVar1->parent = root;
    }
    root = root->children[uVar2];
    addr = addr >> 4;
    level = level + -1;
  }
  return root;
}

Assistant:

ColorQuant::Node*
ColorQuant::getNode(ColorQuant::Node *root, uint32 addr, int32 level)
{
	if(level == 0)
		return root;

	uint32 a = addr & 0xF;
	if(root->children[a] == nil){
		root->children[a] = this->createNode(level-1);
		root->children[a]->parent = root;
	}

	return this->getNode(root->children[a], addr>>4, level-1);
}